

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O1

void fl_draw(char *str,int x,int y,int w,int h,Fl_Align align,
            _func_void_char_ptr_int_int_int *callthis,Fl_Image *img,int draw_symbols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  Fl_Image *pFVar9;
  uint uVar10;
  int iVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  double extraout_XMM0_Qa;
  int buflen;
  double width;
  char *linebuf;
  char symbol [2] [255];
  int local_2e4;
  ulong local_2c8;
  int local_284;
  ulong local_280;
  char *local_278;
  ulong local_270;
  double local_268;
  ulong local_260;
  double local_258;
  char *local_250;
  int local_244;
  int local_240;
  uint local_23c;
  char local_238 [255];
  char local_139 [265];
  
  pFVar9 = (Fl_Image *)0x0;
  if ((align >> 9 & 1) == 0) {
    pFVar9 = img;
  }
  local_250 = (char *)0x0;
  if (img == (Fl_Image *)0x0) {
    pFVar9 = img;
  }
  local_238[0] = '\0';
  local_139[0] = '\0';
  if (draw_symbols == 0) {
    iVar1 = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (str == (char *)0x0) {
      str = (char *)0x0;
      iVar1 = 0;
    }
    else if ((*str == '@') && ((str[1] & 0xbfU) != 0)) {
      cVar12 = *str;
      if (cVar12 == '\0') {
        pcVar7 = local_238;
      }
      else {
        uVar14 = 0;
        do {
          uVar16 = uVar14;
          iVar1 = isspace((int)cVar12);
          if ((iVar1 != 0) || (0xfd < uVar16)) {
            str = str + uVar16;
            pcVar7 = local_238 + uVar16;
            goto LAB_00195175;
          }
          local_238[uVar16] = cVar12;
          cVar12 = str[uVar16 + 1];
          uVar14 = uVar16 + 1;
        } while (cVar12 != '\0');
        pcVar7 = local_238 + uVar16 + 1;
        str = str + uVar16 + 1;
      }
LAB_00195175:
      *pcVar7 = '\0';
      iVar1 = isspace((int)cVar12);
      str = str + (iVar1 != 0);
      iVar1 = h;
      if (w < h) {
        iVar1 = w;
      }
    }
    else {
      iVar1 = 0;
    }
    if (str == (char *)0x0) {
      str = (char *)0x0;
    }
    else {
      pcVar7 = strrchr(str,0x40);
      if (((str + 1 < pcVar7 && pcVar7 != (char *)0x0) && (pcVar7[-1] != '@')) &&
         (fl_strlcpy(local_139,pcVar7,0xff), iVar2 = h, w < h)) {
        iVar2 = w;
      }
    }
  }
  local_260 = 0;
  if (((align >> 8 & 1) != 0) && (pFVar9 != (Fl_Image *)0x0)) {
    local_260 = (ulong)(uint)pFVar9->w_;
  }
  local_280 = (ulong)(uint)y;
  local_278 = str;
  if (str != (char *)0x0) {
    iVar3 = (int)local_260;
    iVar6 = 0;
    iVar13 = 1;
    do {
      str = expand_text_(str,&local_250,0,(double)(w - (iVar1 + iVar2 + iVar3)),&local_284,
                         &local_258,align & 0x80,draw_symbols);
      iVar4 = (int)local_258;
      if (local_258 <= (double)iVar6) {
        iVar4 = iVar6;
      }
      iVar6 = iVar4;
      if (*str == '@') {
        if ((draw_symbols != 0) && (str[1] != '@')) goto LAB_001952f6;
      }
      else if (*str == '\0') goto LAB_001952f6;
      iVar13 = iVar13 + 1;
    } while( true );
  }
  iVar13 = 0;
  iVar6 = 0;
LAB_00195306:
  if (iVar13 != 0 && (iVar2 != 0 || iVar1 != 0)) {
    bVar20 = iVar1 != 0;
    iVar1 = 0;
    if (bVar20) {
      iVar1 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar1 = iVar1 * iVar13;
    }
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar2 = iVar2 * iVar13;
    }
  }
  bVar20 = (align >> 8 & 1) != 0;
  bVar21 = pFVar9 == (Fl_Image *)0x0;
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  local_268 = (double)CONCAT44(local_268._4_4_,iVar3);
  iVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar3 = 0;
  if (!bVar21 && !bVar20) {
    iVar3 = pFVar9->h_;
  }
  if ((align & 2) == 0) {
    if ((align & 1) == 0) {
      local_2c8 = (ulong)(uint)((h - (iVar4 * iVar13 + iVar3)) / 2 + iVar4 + y);
    }
    else {
      local_2c8 = (ulong)(uint)(iVar4 + y);
    }
  }
  else {
    local_2c8 = (ulong)(uint)(((1 - iVar13) * iVar4 + h + y) - iVar3);
  }
  iVar3 = iVar2 + iVar1;
  local_2e4 = 0;
  if ((char)((align & 0x20) >> 5) != '\0' || (bVar21 || bVar20)) {
    local_270 = 0;
  }
  else {
    uVar18 = pFVar9->w_;
    local_270 = 0;
    if (0 < (int)uVar18) {
      local_270 = (ulong)uVar18;
    }
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        uVar14 = (ulong)(uint)((int)(w - (iVar3 + uVar18)) / 2 + x + iVar1);
      }
      else {
        uVar14 = (ulong)((w + x) - (iVar2 + uVar18));
      }
    }
    else {
      uVar14 = (ulong)(uint)(iVar1 + x);
    }
    (*pFVar9->_vptr_Fl_Image[7])
              (pFVar9,uVar14,(ulong)(uint)((int)local_2c8 - iVar4),(ulong)uVar18,
               (ulong)(uint)pFVar9->h_,0,0);
    local_2c8 = (ulong)(uint)((int)local_2c8 + pFVar9->h_);
  }
  iVar17 = 0;
  if (pFVar9 != (Fl_Image *)0x0 && (align >> 8 & 1) != 0) {
    iVar19 = pFVar9->w_;
    if ((align & 0x20) == 0) {
      iVar17 = iVar1;
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar17 = (w - (iVar6 + iVar3 + iVar19)) / 2;
          goto LAB_001955cf;
        }
        uVar18 = ~(iVar6 + iVar2 + iVar19) + x + w;
      }
      else {
LAB_001955cf:
        uVar18 = (x + iVar17) - 1;
      }
      iVar17 = 0;
      local_2e4 = iVar19;
    }
    else {
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar17 = iVar6 + x + iVar1;
          iVar6 = (w - (iVar3 + iVar6 + iVar19)) / 2;
          goto LAB_001955e2;
        }
        iVar17 = (w + x) - (iVar2 + iVar19);
      }
      else {
        iVar17 = iVar6 + x;
        iVar6 = iVar1;
LAB_001955e2:
        iVar17 = iVar17 + iVar6;
      }
      uVar18 = iVar17 + 1;
      local_2e4 = 0;
      iVar17 = iVar19;
    }
    uVar10 = (int)local_2c8 - iVar4;
    if ((align & 1) == 0) {
      uVar5 = ~pFVar9->h_;
      if ((align & 2) == 0) {
        uVar5 = (int)(local_268._0_4_ * iVar13 + uVar5) / 2;
      }
      else {
        uVar10 = uVar10 + local_268._0_4_ * iVar13;
      }
      uVar10 = uVar10 + uVar5;
    }
    (*pFVar9->_vptr_Fl_Image[7])
              (pFVar9,(ulong)uVar18,(ulong)uVar10,(ulong)(uint)pFVar9->w_,(ulong)(uint)pFVar9->h_,0,
               0);
  }
  if (local_278 != (char *)0x0) {
    iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
    local_268 = (double)(w - ((int)local_260 + iVar3));
    local_23c = align & 0x80;
    iVar19 = iVar1 + x + local_2e4;
    local_240 = x + w;
    local_244 = iVar2 + iVar17;
    local_260 = (ulong)(uint)-iVar6;
    pcVar7 = local_278;
    do {
      pcVar8 = "";
      if (1 < iVar13) {
        pcVar8 = expand_text_(pcVar7,&local_250,0,local_268,&local_284,&local_258,local_23c,
                              draw_symbols);
      }
      pcVar7 = pcVar8;
      pcVar8 = local_250;
      iVar6 = local_284;
      iVar11 = (int)local_270;
      uVar18 = (uint)(local_258 + 0.5);
      local_270 = local_270 & 0xffffffff;
      if ((double)iVar11 < local_258) {
        local_270 = (ulong)uVar18;
      }
      iVar11 = iVar19;
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar11 = (int)(w - (uVar18 + local_2e4 + iVar3 + iVar17)) / 2 + iVar19;
        }
        else {
          iVar11 = local_240 - (uVar18 + local_244);
        }
      }
      iVar15 = (int)local_2c8 + (int)local_260;
      (*callthis)(local_250,local_284,iVar11,iVar15);
      if ((underline_at != (char *)0x0) && (underline_at < pcVar8 + iVar6 && pcVar8 <= underline_at)
         ) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pcVar8,(ulong)(uint)((int)underline_at - (int)pcVar8));
        (*callthis)("_",1,iVar11 + (int)extraout_XMM0_Qa,iVar15);
      }
      if (*pcVar7 == '@') {
        if (pcVar7[1] != '@') goto LAB_001958ad;
      }
      else if (*pcVar7 == '\0') goto LAB_001958ad;
      local_2c8 = (ulong)(uint)((int)local_2c8 + iVar4);
    } while( true );
  }
LAB_001958b7:
  uVar18 = (uint)local_270;
  if (((align & 0x20) != 0) && (!bVar21 && !bVar20)) {
    uVar10 = pFVar9->w_;
    if ((int)uVar18 < (int)uVar10) {
      uVar18 = uVar10;
    }
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        uVar14 = (ulong)(uint)((int)(w - (iVar3 + uVar10)) / 2 + x + iVar1);
      }
      else {
        uVar14 = (ulong)(((w + x) - iVar2) - uVar10);
      }
    }
    else {
      uVar14 = (ulong)(uint)(iVar1 + x);
    }
    (*pFVar9->_vptr_Fl_Image[7])(pFVar9,uVar14,local_2c8,(ulong)uVar10,(ulong)(uint)pFVar9->h_,0,0);
  }
  if (iVar1 != 0) {
    iVar13 = x;
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar13 = (int)(w - (iVar3 + uVar18)) / 2 + x;
      }
      else {
        iVar13 = (w + x) - (iVar3 + uVar18);
      }
    }
    if ((align & 2) == 0) {
      iVar6 = y;
      if ((align & 1) == 0) {
        iVar6 = (h - iVar1) / 2 + y;
      }
    }
    else {
      iVar6 = (y + h) - iVar1;
    }
    fl_draw_symbol(local_238,iVar13,iVar6,iVar1,iVar1,fl_graphics_driver->color_);
  }
  if (iVar2 != 0) {
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar1 = iVar1 + x + uVar18 + (int)(w - (iVar3 + uVar18)) / 2;
      }
      else {
        iVar1 = (w + x) - iVar2;
      }
    }
    else {
      iVar1 = iVar1 + x + uVar18;
    }
    if ((align & 2) == 0) {
      if ((align & 1) == 0) {
        y = (h - iVar2) / 2 + y;
      }
    }
    else {
      y = (h + y) - iVar2;
    }
    fl_draw_symbol(local_139,iVar1,y,iVar2,iVar2,fl_graphics_driver->color_);
  }
  return;
LAB_001952f6:
  y = (int)local_280;
  goto LAB_00195306;
LAB_001958ad:
  y = (int)local_280;
  goto LAB_001958b7;
}

Assistant:

void fl_draw(
    const char* str,	// the (multi-line) string
    int x, int y, int w, int h,	// bounding box
    Fl_Align align,
    void (*callthis)(const char*,int,int,int),
    Fl_Image* img, int draw_symbols)
{
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  char symbol[2][255], *symptr;
  int symwidth[2], symoffset, symtotal, imgtotal;

  // count how many lines and put the last one into the buffer:
  int lines;
  double width;

  // if the image is set as a backdrop, ignore it here
  if (img && (align & FL_ALIGN_IMAGE_BACKDROP)) img = 0;

  symbol[0][0] = '\0';
  symwidth[0]  = 0;

  symbol[1][0] = '\0';
  symwidth[1]  = 0;

  if (draw_symbols) {
    if (str && str[0] == '@' && str[1] && str[1] != '@') {
      // Start with a symbol...
      for (symptr = symbol[0];
           *str && !isspace(*str) && symptr < (symbol[0] + sizeof(symbol[0]) - 1);
           *symptr++ = *str++) {/*empty*/}
      *symptr = '\0';
      if (isspace(*str)) str++;
      symwidth[0] = (w < h ? w : h);
    }

    if (str && (p = strrchr(str, '@')) != NULL && p > (str + 1) && p[-1] != '@') {
      strlcpy(symbol[1], p, sizeof(symbol[1]));
      symwidth[1] = (w < h ? w : h);
    }
  }

  symtotal = symwidth[0] + symwidth[1];
  imgtotal = (img && (align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)) ? img->w() : 0;

  int strw = 0;
  int strh;

  if (str) {
    for (p = str, lines=0; p;) {
      e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen, width,
                         align&FL_ALIGN_WRAP, draw_symbols);
      if (strw<width) strw = (int)width;
      lines++;
      if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
      p = e;
    }
  } else lines = 0;

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];
  strh = lines * fl_height();

  // figure out vertical position of the first line:
  int xpos;
  int ypos;
  int height = fl_height();
  int imgvert = ((align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)==0);
  int imgh = img && imgvert ? img->h() : 0;
  int imgw[2] = {0, 0};

  symoffset = 0;

  if (align & FL_ALIGN_BOTTOM) ypos = y+h-(lines-1)*height-imgh;
  else if (align & FL_ALIGN_TOP) ypos = y+height;
  else ypos = y+(h-lines*height-imgh)/2+height;

  // draw the image unless the "text over image" alignment flag is set...
  if (img && imgvert && !(align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos - height);
    ypos += img->h();
  }

  // draw the image to the side of the text
  if (img && !imgvert /* && (align & !FL_ALIGN_TEXT_NEXT_TO_IMAGE)*/ ) {
    if (align & FL_ALIGN_TEXT_OVER_IMAGE) { // image is right of text
      imgw[1] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + strw + 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - imgw[1] + 1;
      else xpos = x + (w - strw - symtotal - imgw[1]) / 2 + symwidth[0] + strw + 1;
    } else { // image is to the left of the text
      imgw[0] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] - 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - strw - imgw[0] - 1;
      else xpos = x + (w - strw - symtotal - imgw[0]) / 2 - 1;
    }
    int yimg = ypos - height;
    if (align & FL_ALIGN_TOP) ;
    else if (align & FL_ALIGN_BOTTOM) yimg += strh - img->h() - 1;
    else yimg += (strh - img->h() - 1) / 2;
    img->draw(xpos, yimg);
  }

  // now draw all the lines:
  if (str) {
    int desc = fl_descent();
    for (p=str; ; ypos += height) {
      if (lines>1) e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen,
				width, align&FL_ALIGN_WRAP, draw_symbols);
      else e = "";

      if (width > symoffset) symoffset = (int)(width + 0.5);

      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + imgw[0];
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - (int)(width + .5) - symwidth[1] - imgw[1];
      else xpos = x + (w - (int)(width + .5) - symtotal - imgw[0] - imgw[1]) / 2 + symwidth[0] + imgw[0];

      callthis(linebuf,buflen,xpos,ypos-desc);

      if (underline_at && underline_at >= linebuf && underline_at < (linebuf + buflen))
	callthis("_",1,xpos+int(fl_width(linebuf,(int) (underline_at-linebuf))),ypos-desc);

      if (!*e || (*e == '@' && e[1] != '@')) break;
      p = e;
    }
  }

  // draw the image if the "text over image" alignment flag is set...
  if (img && imgvert && (align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos);
  }

  // draw the symbols, if any...
  if (symwidth[0]) {
    // draw to the left
    if (align & FL_ALIGN_LEFT) xpos = x;
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symtotal - symoffset;
    else xpos = x + (w - symoffset - symtotal) / 2;

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[0];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[0]) / 2;

    fl_draw_symbol(symbol[0], xpos, ypos, symwidth[0], symwidth[0], fl_color());
  }

  if (symwidth[1]) {
    // draw to the right
    if (align & FL_ALIGN_LEFT) xpos = x + symoffset + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1];
    else xpos = x + (w - symoffset - symtotal) / 2 + symoffset + symwidth[0];

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[1];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[1]) / 2;

    fl_draw_symbol(symbol[1], xpos, ypos, symwidth[1], symwidth[1], fl_color());
  }
}